

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::ListInnerProductFun::GetFunctions(void)

{
  LogicalType varargs;
  LogicalType varargs_00;
  NotImplementedException *this;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  pointer child;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  LogicalType list;
  undefined4 in_stack_fffffffffffffc44;
  undefined4 in_stack_fffffffffffffc4c;
  FunctionNullHandling in_stack_fffffffffffffc58;
  bind_lambda_function_t in_stack_fffffffffffffc60;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  ScalarFunctionSet *local_378;
  _func_int **local_370;
  vector<duckdb::ScalarFunction,_true> *local_368;
  undefined1 local_360 [48];
  _Any_data *local_330;
  _Any_data *local_328;
  LogicalType *local_320;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_318;
  string local_300;
  LogicalType local_2e0;
  LogicalType local_2c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2b0;
  LogicalType local_298;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"list_inner_product","");
  local_378 = in_RDI;
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  LogicalType::Real();
  local_320 = local_318.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_318.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_318.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_368 = &(local_378->super_FunctionSet<duckdb::ScalarFunction>).functions;
    local_330 = (_Any_data *)&local_280.function;
    local_328 = (_Any_data *)&local_158.function;
    local_370 = (_func_int **)&PTR__ScalarFunction_02476950;
    child = local_318.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start;
    do {
      LogicalType::LIST(&local_298,child);
      if (child->id_ == DOUBLE) {
        LogicalType::LogicalType((LogicalType *)local_360,&local_298);
        LogicalType::LogicalType((LogicalType *)(local_360 + 0x18),&local_298);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)local_360;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_2b0,__l_00,(allocator_type *)&stack0xfffffffffffffc67);
        LogicalType::LogicalType(&local_2c8,child);
        local_398._8_8_ = 0;
        local_398._0_8_ = ListGenericFold<double,duckdb::InnerProductOp>;
        local_388._8_8_ =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_388._0_8_ =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        LogicalType::LogicalType(&local_2e0,INVALID);
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_00._0_8_ = &local_2e0;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffc44;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffc4c;
        ScalarFunction::ScalarFunction
                  (&local_280,(vector<duckdb::LogicalType,_true> *)&local_2b0,&local_2c8,
                   (scalar_function_t *)local_398,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffffc58,
                   in_stack_fffffffffffffc60);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_368->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_280);
        local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             local_370;
        if (local_280.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_280.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_280.function.super__Function_base._M_manager)
                    (local_330,local_330,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_2e0);
        if ((_Manager_type)local_388._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_388._0_8_)(local_398,local_398,3);
        }
        LogicalType::~LogicalType(&local_2c8);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_2b0);
        lVar1 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_360 + lVar1));
          lVar1 = lVar1 + -0x18;
        } while (lVar1 != -0x18);
      }
      else {
        if (child->id_ != FLOAT) {
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_360._0_8_ = local_360 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_360,"List function not implemented for type %s","");
          LogicalType::ToString_abi_cxx11_((string *)local_398,child);
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this,(string *)local_360,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
          ;
          __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LogicalType::LogicalType((LogicalType *)local_360,&local_298);
        LogicalType::LogicalType((LogicalType *)(local_360 + 0x18),&local_298);
        __l._M_len = 2;
        __l._M_array = (iterator)local_360;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_2b0,__l,(allocator_type *)&stack0xfffffffffffffc67);
        LogicalType::LogicalType(&local_2c8,child);
        local_398._8_8_ = 0;
        local_398._0_8_ = ListGenericFold<float,duckdb::InnerProductOp>;
        local_388._8_8_ =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_388._0_8_ =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        LogicalType::LogicalType(&local_2e0,INVALID);
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs._0_8_ = &local_2e0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffc44;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffc4c;
        ScalarFunction::ScalarFunction
                  (&local_158,(vector<duckdb::LogicalType,_true> *)&local_2b0,&local_2c8,
                   (scalar_function_t *)local_398,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffc58,
                   in_stack_fffffffffffffc60);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_368->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_158);
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             local_370;
        if (local_158.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_158.function.super__Function_base._M_manager)
                    (local_328,local_328,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_2e0);
        if ((_Manager_type)local_388._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_388._0_8_)(local_398,local_398,3);
        }
        LogicalType::~LogicalType(&local_2c8);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_2b0);
        lVar1 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_360 + lVar1));
          lVar1 = lVar1 + -0x18;
        } while (lVar1 != -0x18);
      }
      LogicalType::~LogicalType(&local_298);
      child = child + 1;
    } while (child != local_320);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_318);
  return local_378;
}

Assistant:

ScalarFunctionSet ListInnerProductFun::GetFunctions() {
	ScalarFunctionSet set("list_inner_product");
	for (auto &type : LogicalType::Real()) {
		AddListFoldFunction<InnerProductOp>(set, type);
	}
	return set;
}